

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void aiGetExtensionList(aiString *szOut)

{
  Importer tmp;
  Importer local_10;
  
  if (szOut != (aiString *)0x0) {
    Assimp::Importer::Importer(&local_10);
    Assimp::Importer::GetExtensionList(&local_10,szOut);
    Assimp::Importer::~Importer(&local_10);
    return;
  }
  __assert_fail("__null != szOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x1ec,"void aiGetExtensionList(aiString *)");
}

Assistant:

void aiGetExtensionList(aiString* szOut)
{
    ai_assert(NULL != szOut);
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // FIXME: no need to create a temporary Importer instance just for that ..
    Assimp::Importer tmp;
    tmp.GetExtensionList(*szOut);

    ASSIMP_END_EXCEPTION_REGION(void);
}